

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

cram_codec *
cram_byte_array_len_decode_init(char *data,int size,cram_external_type option,int version)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  cram_codec *__ptr;
  cram_codec *pcVar4;
  cram_encoding cVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  cram_encoding cVar9;
  char *data_00;
  long lStack_40;
  
  __ptr = (cram_codec *)malloc(0x240);
  if (__ptr == (cram_codec *)0x0) {
    return (cram_codec *)0x0;
  }
  __ptr->codec = E_BYTE_ARRAY_LEN;
  __ptr->decode = cram_byte_array_len_decode;
  __ptr->free = cram_byte_array_len_decode_free;
  bVar1 = *data;
  cVar9 = (cram_encoding)bVar1;
  lVar2 = 1;
  lVar6 = lVar2;
  if (-1 < (char)bVar1) goto LAB_00147379;
  cVar5 = (cram_encoding)(byte)data[1];
  uVar8 = (uint)bVar1;
  if (bVar1 < 0xc0) {
    lStack_40 = 2;
    cVar9 = (uVar8 & 0x3f) << 8;
  }
  else {
    if (bVar1 < 0xe0) {
      cVar9 = (uVar8 & 0x1f) << 0x10 | cVar5 << 8 | (uint)(byte)data[2];
      lVar6 = 3;
      goto LAB_00147379;
    }
    if (bVar1 < 0xf0) {
      cVar9 = (uVar8 & 0xf) << 0x18 | cVar5 << 0x10 | (uint)(byte)data[2] << 8 | (uint)(byte)data[3]
      ;
      lVar6 = 4;
      goto LAB_00147379;
    }
    lStack_40 = 5;
    cVar5 = (uint)(byte)data[3] << 4 | (uint)(byte)data[2] << 0xc | cVar5 << 0x14 | uVar8 << 0x1c;
    cVar9 = (byte)data[4] & (E_GOLOMB_RICE|E_SUBEXP);
  }
  cVar9 = cVar9 | cVar5;
  lVar6 = lStack_40;
LAB_00147379:
  bVar1 = data[lVar6];
  uVar8 = (uint)bVar1;
  lStack_40 = lVar2;
  if ((char)bVar1 < '\0') {
    uVar7 = (uint)bVar1;
    uVar8 = (uint)(byte)data[lVar6 + 1];
    if (bVar1 < 0xc0) {
      uVar8 = (uVar7 & 0x3f) << 8 | uVar8;
      lStack_40 = 2;
    }
    else if (bVar1 < 0xe0) {
      uVar8 = (uVar7 & 0x1f) << 0x10 | uVar8 << 8 | (uint)(byte)data[lVar6 + 2];
      lStack_40 = 3;
    }
    else if (bVar1 < 0xf0) {
      uVar8 = (uVar7 & 0xf) << 0x18 | uVar8 << 0x10 | (uint)(byte)data[lVar6 + 2] << 8 |
              (uint)(byte)data[lVar6 + 3];
      lStack_40 = 4;
    }
    else {
      uVar8 = (byte)data[lVar6 + 4] & 0xf |
              (uint)(byte)data[lVar6 + 3] << 4 |
              (uint)(byte)data[lVar6 + 2] << 0xc | uVar8 << 0x14 | uVar7 << 0x1c;
      lStack_40 = 5;
    }
  }
  data_00 = data + lStack_40 + lVar6;
  pcVar4 = cram_decoder_init(cVar9,data_00,uVar8,E_INT,version);
  (__ptr->field_6).byte_array_len.len_codec = pcVar4;
  lVar6 = (long)(int)uVar8;
  bVar1 = data_00[lVar6];
  cVar9 = (cram_encoding)bVar1;
  lStack_40 = lVar2;
  if ((char)bVar1 < '\0') {
    uVar8 = (uint)bVar1;
    cVar9 = (cram_encoding)(byte)data_00[lVar6 + 1];
    if (bVar1 < 0xc0) {
      cVar9 = (uVar8 & 0x3f) << 8 | cVar9;
      lStack_40 = 2;
    }
    else if (bVar1 < 0xe0) {
      cVar9 = (uVar8 & 0x1f) << 0x10 | cVar9 << 8 | (uint)(byte)data_00[lVar6 + 2];
      lStack_40 = 3;
    }
    else if (bVar1 < 0xf0) {
      cVar9 = (uVar8 & 0xf) << 0x18 | cVar9 << 0x10 | (uint)(byte)data_00[lVar6 + 2] << 8 |
              (uint)(byte)data_00[lVar6 + 3];
      lStack_40 = 4;
    }
    else {
      cVar9 = (byte)data_00[lVar6 + 4] & (E_GOLOMB_RICE|E_SUBEXP) |
              (uint)(byte)data_00[lVar6 + 3] << 4 |
              (uint)(byte)data_00[lVar6 + 2] << 0xc | cVar9 << 0x14 | uVar8 << 0x1c;
      lStack_40 = 5;
    }
  }
  lVar3 = lStack_40 + lVar6;
  bVar1 = data_00[lStack_40 + lVar6];
  uVar8 = (uint)bVar1;
  lStack_40 = lVar2;
  if ((char)bVar1 < '\0') {
    uVar7 = (uint)bVar1;
    uVar8 = (uint)(byte)data_00[lVar3 + 1];
    if (bVar1 < 0xc0) {
      uVar8 = (uVar7 & 0x3f) << 8 | uVar8;
      lStack_40 = 2;
    }
    else if (bVar1 < 0xe0) {
      uVar8 = (uVar7 & 0x1f) << 0x10 | uVar8 << 8 | (uint)(byte)data_00[lVar3 + 2];
      lStack_40 = 3;
    }
    else if (bVar1 < 0xf0) {
      uVar8 = (uVar7 & 0xf) << 0x18 | uVar8 << 0x10 | (uint)(byte)data_00[lVar3 + 2] << 8 |
              (uint)(byte)data_00[lVar3 + 3];
      lStack_40 = 4;
    }
    else {
      uVar8 = (byte)data_00[lVar3 + 4] & 0xf |
              (uint)(byte)data_00[lVar3 + 3] << 4 |
              (uint)(byte)data_00[lVar3 + 2] << 0xc | uVar8 << 0x14 | uVar7 << 0x1c;
      lStack_40 = 5;
    }
  }
  pcVar4 = cram_decoder_init(cVar9,data_00 + lStack_40 + lVar3,uVar8,option,version);
  (__ptr->field_6).byte_array_len.value_codec = pcVar4;
  if (data_00 + lStack_40 + lVar3 + ((long)(int)uVar8 - (long)data) != (char *)(long)size) {
    fwrite("Malformed byte_array_len header stream\n",0x27,1,_stderr);
    free(__ptr);
    return (cram_codec *)0x0;
  }
  return __ptr;
}

Assistant:

cram_codec *cram_byte_array_len_decode_init(char *data, int size,
					    enum cram_external_type option,
					    int version) {
    cram_codec *c;
    char *cp = data;
    int32_t encoding;
    int32_t sub_size;

    if (!(c = malloc(sizeof(*c))))
	return NULL;

    c->codec  = E_BYTE_ARRAY_LEN;
    c->decode = cram_byte_array_len_decode;
    c->free   = cram_byte_array_len_decode_free;
    
    cp += itf8_get(cp, &encoding);
    cp += itf8_get(cp, &sub_size);
    c->byte_array_len.len_codec = cram_decoder_init(encoding, cp, sub_size,
						    E_INT, version);
    cp += sub_size;

    cp += itf8_get(cp, &encoding);
    cp += itf8_get(cp, &sub_size);
    c->byte_array_len.value_codec = cram_decoder_init(encoding, cp, sub_size,
						      option, version);
    cp += sub_size;

    if (cp - data != size) {
	fprintf(stderr, "Malformed byte_array_len header stream\n");
	free(c);
	return NULL;
    }

    return c;
}